

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O1

CborError preparse_next_value(CborValue *it)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  CborError CVar7;
  uint32_t uVar8;
  byte bVar9;
  byte bVar10;
  ushort uVar11;
  
  if ((it->remaining != 0xffffffff && it->type != 0xc0) &&
     (uVar8 = it->remaining - 1, it->remaining = uVar8, uVar8 == 0)) {
    it->type = 0xff;
    it->flags = it->flags & 0xef;
    return CborNoError;
  }
  if (it->type != 0xc0) {
    it->flags = it->flags ^ 0x40;
    CVar7 = preparse_next_value_nodecrement(it);
    return CVar7;
  }
  if (it->remaining == 0xffffffff) {
    puVar3 = (it->source).ptr;
    if ((*(long *)(puVar3 + 0x18) != *(long *)(puVar3 + 0x68)) &&
       (*(char *)(*(long *)(puVar3 + 0x10) + *(long *)(puVar3 + 0x68)) == -1)) {
      CVar7 = CborErrorUnexpectedBreak;
      if (((~it->flags & 0x60) != 0) && (it->type != 0xc0)) {
        it->type = 0xff;
        it->remaining = 0;
        it->flags = it->flags | 0x10;
        CVar7 = CborNoError;
      }
      return CVar7;
    }
  }
  it->type = 0xff;
  bVar9 = it->flags & 0x60;
  it->flags = bVar9;
  puVar3 = (it->source).ptr;
  lVar4 = *(long *)(puVar3 + 0x18);
  lVar5 = *(long *)(puVar3 + 0x68);
  if (lVar4 == lVar5) {
    return CborErrorUnexpectedEOF;
  }
  bVar1 = *(byte *)(*(long *)(puVar3 + 0x10) + lVar5);
  it->type = bVar1 & 0xe0;
  uVar11 = bVar1 & 0x1f;
  it->extra = uVar11;
  bVar10 = (byte)uVar11;
  if (bVar10 < 0x1c) {
    uVar6 = 1 << (bVar10 - 0x18 & 0x1f);
    if (0x17 < bVar10) {
      if ((ulong)(lVar4 - lVar5) <= (ulong)uVar6) {
        return CborErrorUnexpectedEOF;
      }
      it->extra = 0;
      if (uVar6 == 2) {
        uVar2 = *(ushort *)(*(long *)(puVar3 + 0x10) + 1 + lVar5);
        it->extra = uVar2 << 8 | uVar2 >> 8;
      }
      else if (uVar6 == 1) {
        it->extra = (ushort)*(byte *)(*(long *)(puVar3 + 0x10) + 1 + lVar5);
      }
      else {
        it->flags = bVar1 & 3 | bVar9;
      }
    }
    if (bVar1 >> 5 == 7) {
      switch(uVar11) {
      case 0x14:
        it->extra = 0;
        it->type = 0xf5;
        break;
      case 0x18:
        if (0x1f < it->extra) {
          return CborNoError;
        }
        it->type = 0xff;
        return CborErrorIllegalSimpleType;
      case 0x1a:
      case 0x1b:
        it->flags = it->flags | 2;
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x19:
        it->type = *(uint8_t *)(*(long *)(puVar3 + 0x10) + *(long *)(puVar3 + 0x68));
      }
    }
    else if (bVar1 >> 5 == 1) {
      it->flags = it->flags | 4;
      it->type = '\0';
    }
  }
  else {
    if (bVar10 != 0x1f) {
      return (uint)(bVar1 < 0xe0) * 2 + CborErrorUnknownType;
    }
    uVar6 = bVar1 >> 5 ^ 4;
    if ((7 < uVar6) || ((0xc3U >> uVar6 & 1) == 0)) {
      return (uint)(bVar1 < 0xe0) * 3 + CborErrorUnexpectedBreak;
    }
    it->flags = bVar9 | 0x10;
    it->type = bVar1 & 0xe0;
  }
  return CborNoError;
}

Assistant:

static CborError preparse_next_value(CborValue *it)
{
    /* tags don't count towards item totals or whether we've successfully
     * read a map's key or value */
    bool itemCounts = it->type != CborTagType;

    if (it->remaining != UINT32_MAX) {
        if (itemCounts && --it->remaining == 0) {
            it->type = CborInvalidType;
            it->flags &= ~CborIteratorFlag_UnknownLength; /* no Break to consume */
            return CborNoError;
        }
    }
    if (itemCounts) {
        /* toggle the flag indicating whether this was a map key */
        it->flags ^= CborIteratorFlag_NextIsMapKey;
    }
    return preparse_next_value_nodecrement(it);
}